

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v11::vprintln(FILE *f,string_view fmt,format_args args)

{
  format_args args_00;
  string_view fmt_00;
  undefined8 this;
  char *s;
  size_t count;
  unsigned_long_long uVar1;
  string_view text;
  basic_string_view<char> local_2a0;
  char local_28d [13];
  locale_ref local_280;
  unsigned_long_long local_278;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aStack_270;
  char *local_268;
  size_t sStack_260;
  allocator<char> local_249;
  undefined1 local_248 [8];
  memory_buffer buffer;
  FILE *f_local;
  format_args args_local;
  string_view fmt_local;
  
  buffer._528_8_ = f;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)local_248,
             &local_249);
  local_278 = args.desc_;
  aStack_270 = args.field_1;
  local_268 = fmt.data_;
  sStack_260 = fmt.size_;
  detail::locale_ref::locale_ref(&local_280);
  fmt_00.size_ = sStack_260;
  fmt_00.data_ = local_268;
  args_00.field_1.args_ = aStack_270.args_;
  args_00.desc_ = local_278;
  uVar1 = local_278;
  detail::vformat_to((buffer<char> *)local_248,fmt_00,args_00,local_280);
  local_28d[0] = '\n';
  detail::buffer<char>::push_back((buffer<char> *)local_248,local_28d);
  this = buffer._528_8_;
  s = detail::buffer<char>::data((buffer<char> *)local_248);
  count = detail::buffer<char>::size((buffer<char> *)local_248);
  basic_string_view<char>::basic_string_view(&local_2a0,s,count);
  text.size_ = uVar1;
  text.data_ = (char *)local_2a0.size_;
  detail::print((detail *)this,(FILE *)local_2a0.data_,text);
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)local_248);
  return;
}

Assistant:

FMT_FUNC void vprintln(std::FILE* f, string_view fmt, format_args args) {
  auto buffer = memory_buffer();
  detail::vformat_to(buffer, fmt, args);
  buffer.push_back('\n');
  detail::print(f, {buffer.data(), buffer.size()});
}